

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wat-lexer.cpp
# Opt level: O3

void __thiscall LexerTest_LexInfinity_Test::TestBody(LexerTest_LexInfinity_Test *this)

{
  byte bVar1;
  ulong uVar2;
  char *pcVar3;
  char *in_R9;
  pointer *__ptr;
  _Storage<double,_true> extraout_XMM0_Qa;
  _Storage<double,_true> extraout_XMM0_Qa_00;
  _Storage<double,_true> extraout_XMM0_Qa_01;
  string_view buffer;
  string_view buffer_00;
  string_view buffer_01;
  string_view buffer_02;
  string_view buffer_03;
  string_view buffer_04;
  string_view buffer_05;
  string_view buffer_06;
  string_view buffer_07;
  string_view buffer_08;
  string_view buffer_09;
  string_view buffer_10;
  string_view buffer_11;
  string_view buffer_12;
  _Storage<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
  local_2c8;
  bool local_2a8;
  _Storage<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
  local_2a0;
  bool local_280;
  _Storage<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
  local_278;
  bool local_258;
  _Storage<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
  local_250;
  bool local_230;
  _Storage<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
  local_228;
  bool local_208;
  _Storage<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
  local_200;
  bool local_1e0;
  _Storage<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
  local_1d8;
  bool local_1b8;
  _Storage<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
  local_1b0;
  bool local_190;
  _Storage<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
  local_188;
  bool local_168;
  _Storage<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
  local_160;
  bool local_140;
  _Storage<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
  local_138;
  bool local_118;
  _Storage<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
  local_110;
  bool local_f0;
  _Storage<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
  local_e8;
  bool local_c8;
  _Storage<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
  local_c0;
  bool local_a0;
  undefined1 local_98 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_88;
  _Storage<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
  local_78;
  bool local_58;
  _Storage<double,_true> local_40;
  undefined1 local_38;
  AssertHelper local_30;
  internal local_28 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_20;
  
  local_2a8 = false;
  buffer._M_str = "inf";
  buffer._M_len = 3;
  ::wasm::WATParser::Lexer::Lexer
            ((Lexer *)local_98,buffer,
             (optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)&local_2c8);
  local_40._M_value = (double)::wasm::WATParser::Lexer::takeF32();
  local_30.data_._0_4_ = 0x7f800000;
  testing::internal::CmpHelperEQ<std::optional<float>,float>
            (local_28,"Lexer(\"inf\"sv).takeF32()","(__builtin_inff ())",
             (optional<float> *)&local_40,(float *)&local_30);
  if (local_58 == true) {
    local_58 = false;
    if (local_78._M_value._M_dataplus._M_p != (_Alloc_hider)((long)&local_78._M_value + 0x10)) {
      operator_delete((void *)local_78._M_value._M_dataplus._M_p,local_78._16_8_ + 1);
    }
  }
  if ((pointer)local_98._8_8_ != (pointer)0x0) {
    operator_delete((void *)local_98._8_8_,local_88._8_8_ - local_98._8_8_);
  }
  if (local_2a8 == true) {
    local_2a8 = false;
    if (local_2c8._M_value._M_dataplus._M_p != (_Alloc_hider)((long)&local_2c8._M_value + 0x10)) {
      operator_delete((void *)local_2c8._M_value._M_dataplus._M_p,local_2c8._16_8_ + 1);
    }
  }
  if (local_28[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_98);
    if (local_20 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = (local_20->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_40,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/wat-lexer.cpp"
               ,0x2a7,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_40,(Message *)local_98);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_40);
    if ((_Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )local_98._0_8_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_98._0_8_ + 8))();
    }
  }
  if (local_20 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_20,local_20);
  }
  local_280 = false;
  buffer_00._M_str = "inf";
  buffer_00._M_len = 3;
  ::wasm::WATParser::Lexer::Lexer
            ((Lexer *)local_98,buffer_00,
             (optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)&local_2a0);
  local_38 = ::wasm::WATParser::Lexer::takeF64();
  local_30.data_._0_4_ = 0x7f800000;
  local_40 = extraout_XMM0_Qa;
  testing::internal::CmpHelperEQ<std::optional<double>,float>
            (local_28,"Lexer(\"inf\"sv).takeF64()","(__builtin_inff ())",
             (optional<double> *)&local_40,(float *)&local_30);
  if (local_58 == true) {
    local_58 = false;
    if (local_78._M_value._M_dataplus._M_p != (_Alloc_hider)((long)&local_78._M_value + 0x10)) {
      operator_delete((void *)local_78._M_value._M_dataplus._M_p,local_78._16_8_ + 1);
    }
  }
  if ((pointer)local_98._8_8_ != (pointer)0x0) {
    operator_delete((void *)local_98._8_8_,local_88._8_8_ - local_98._8_8_);
  }
  if (local_280 == true) {
    local_280 = false;
    if (local_2a0._M_value._M_dataplus._M_p != (_Alloc_hider)((long)&local_2a0._M_value + 0x10)) {
      operator_delete((void *)local_2a0._M_value._M_dataplus._M_p,local_2a0._16_8_ + 1);
    }
  }
  if (local_28[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_98);
    if (local_20 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = (local_20->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_40,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/wat-lexer.cpp"
               ,0x2a8,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_40,(Message *)local_98);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_40);
    if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_98._0_8_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_98._0_8_ + 8))();
    }
  }
  if (local_20 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_20,local_20);
  }
  local_258 = false;
  buffer_01._M_str = "+inf";
  buffer_01._M_len = 4;
  ::wasm::WATParser::Lexer::Lexer
            ((Lexer *)local_98,buffer_01,
             (optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)&local_278);
  local_40._M_value = (double)::wasm::WATParser::Lexer::takeF32();
  local_30.data_._0_4_ = 0x7f800000;
  testing::internal::CmpHelperEQ<std::optional<float>,float>
            (local_28,"Lexer(\"+inf\"sv).takeF32()","(__builtin_inff ())",
             (optional<float> *)&local_40,(float *)&local_30);
  if (local_58 == true) {
    local_58 = false;
    if (local_78._M_value._M_dataplus._M_p != (_Alloc_hider)((long)&local_78._M_value + 0x10)) {
      operator_delete((void *)local_78._M_value._M_dataplus._M_p,local_78._16_8_ + 1);
    }
  }
  if ((pointer)local_98._8_8_ != (pointer)0x0) {
    operator_delete((void *)local_98._8_8_,local_88._8_8_ - local_98._8_8_);
  }
  if (local_258 == true) {
    local_258 = false;
    if (local_278._M_value._M_dataplus._M_p != (_Alloc_hider)((long)&local_278._M_value + 0x10)) {
      operator_delete((void *)local_278._M_value._M_dataplus._M_p,local_278._16_8_ + 1);
    }
  }
  if (local_28[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_98);
    if (local_20 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = (local_20->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_40,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/wat-lexer.cpp"
               ,0x2aa,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_40,(Message *)local_98);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_40);
    if ((_Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
         )local_98._0_8_ !=
        (_Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
         )0x0) {
      (**(code **)(*(long *)local_98._0_8_ + 8))();
    }
  }
  if (local_20 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_20,local_20);
  }
  local_230 = false;
  buffer_02._M_str = "+inf";
  buffer_02._M_len = 4;
  ::wasm::WATParser::Lexer::Lexer
            ((Lexer *)local_98,buffer_02,
             (optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)&local_250);
  local_38 = ::wasm::WATParser::Lexer::takeF64();
  local_30.data_._0_4_ = 0x7f800000;
  local_40 = extraout_XMM0_Qa_00;
  testing::internal::CmpHelperEQ<std::optional<double>,float>
            (local_28,"Lexer(\"+inf\"sv).takeF64()","(__builtin_inff ())",
             (optional<double> *)&local_40,(float *)&local_30);
  if (local_58 == true) {
    local_58 = false;
    if (local_78._M_value._M_dataplus._M_p != (_Alloc_hider)((long)&local_78._M_value + 0x10)) {
      operator_delete((void *)local_78._M_value._M_dataplus._M_p,local_78._16_8_ + 1);
    }
  }
  if ((pointer)local_98._8_8_ != (pointer)0x0) {
    operator_delete((void *)local_98._8_8_,local_88._8_8_ - local_98._8_8_);
  }
  if (local_230 == true) {
    local_230 = false;
    if (local_250._M_value._M_dataplus._M_p != (_Alloc_hider)((long)&local_250._M_value + 0x10)) {
      operator_delete((void *)local_250._M_value._M_dataplus._M_p,local_250._16_8_ + 1);
    }
  }
  if (local_28[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_98);
    if (local_20 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = (local_20->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_40,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/wat-lexer.cpp"
               ,0x2ab,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_40,(Message *)local_98);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_40);
    if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_98._0_8_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_98._0_8_ + 8))();
    }
  }
  if (local_20 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_20,local_20);
  }
  local_208 = false;
  buffer_03._M_str = "-inf";
  buffer_03._M_len = 4;
  ::wasm::WATParser::Lexer::Lexer
            ((Lexer *)local_98,buffer_03,
             (optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)&local_228);
  local_40._M_value = (double)::wasm::WATParser::Lexer::takeF32();
  local_30.data_._0_4_ = 0xff800000;
  testing::internal::CmpHelperEQ<std::optional<float>,float>
            (local_28,"Lexer(\"-inf\"sv).takeF32()","-(__builtin_inff ())",
             (optional<float> *)&local_40,(float *)&local_30);
  if (local_58 == true) {
    local_58 = false;
    if (local_78._M_value._M_dataplus._M_p != (_Alloc_hider)((long)&local_78._M_value + 0x10)) {
      operator_delete((void *)local_78._M_value._M_dataplus._M_p,local_78._16_8_ + 1);
    }
  }
  if ((pointer)local_98._8_8_ != (pointer)0x0) {
    operator_delete((void *)local_98._8_8_,local_88._8_8_ - local_98._8_8_);
  }
  if (local_208 == true) {
    local_208 = false;
    if (local_228._M_value._M_dataplus._M_p != (_Alloc_hider)((long)&local_228._M_value + 0x10)) {
      operator_delete((void *)local_228._M_value._M_dataplus._M_p,local_228._16_8_ + 1);
    }
  }
  if (local_28[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_98);
    if (local_20 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = (local_20->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_40,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/wat-lexer.cpp"
               ,0x2ad,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_40,(Message *)local_98);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_40);
    if ((__uniq_ptr_data<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
         )local_98._0_8_ !=
        (tuple<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      (**(code **)(*(long *)local_98._0_8_ + 8))();
    }
  }
  if (local_20 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_20,local_20);
  }
  local_1e0 = false;
  buffer_04._M_str = "-inf";
  buffer_04._M_len = 4;
  ::wasm::WATParser::Lexer::Lexer
            ((Lexer *)local_98,buffer_04,
             (optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)&local_200);
  local_38 = ::wasm::WATParser::Lexer::takeF64();
  local_30.data_._0_4_ = 0xff800000;
  local_40 = extraout_XMM0_Qa_01;
  testing::internal::CmpHelperEQ<std::optional<double>,float>
            (local_28,"Lexer(\"-inf\"sv).takeF64()","-(__builtin_inff ())",
             (optional<double> *)&local_40,(float *)&local_30);
  if (local_58 == true) {
    local_58 = false;
    if (local_78._M_value._M_dataplus._M_p != (_Alloc_hider)((long)&local_78._M_value + 0x10)) {
      operator_delete((void *)local_78._M_value._M_dataplus._M_p,local_78._16_8_ + 1);
    }
  }
  if ((pointer)local_98._8_8_ != (pointer)0x0) {
    operator_delete((void *)local_98._8_8_,local_88._8_8_ - local_98._8_8_);
  }
  if (local_1e0 == true) {
    local_1e0 = false;
    if (local_200._M_value._M_dataplus._M_p != (_Alloc_hider)((long)&local_200._M_value + 0x10)) {
      operator_delete((void *)local_200._M_value._M_dataplus._M_p,local_200._16_8_ + 1);
    }
  }
  if (local_28[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_98);
    if (local_20 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = (local_20->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_40,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/wat-lexer.cpp"
               ,0x2ae,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_40,(Message *)local_98);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_40);
    if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_98._0_8_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_98._0_8_ + 8))();
    }
  }
  if (local_20 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_20,local_20);
  }
  local_1b8 = false;
  buffer_05._M_str = "infjunk";
  buffer_05._M_len = 7;
  ::wasm::WATParser::Lexer::Lexer
            ((Lexer *)local_98,buffer_05,
             (optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)&local_1d8);
  uVar2 = ::wasm::WATParser::Lexer::takeF32();
  local_28[0] = (internal)((uVar2 >> 0x20 & 1) == 0);
  local_20 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (local_58 == true) {
    local_58 = false;
    if (local_78._M_value._M_dataplus._M_p != (_Alloc_hider)((long)&local_78._M_value + 0x10)) {
      operator_delete((void *)local_78._M_value._M_dataplus._M_p,local_78._16_8_ + 1);
    }
  }
  if ((pointer)local_98._8_8_ != (pointer)0x0) {
    operator_delete((void *)local_98._8_8_,local_88._8_8_ - local_98._8_8_);
  }
  if (local_1b8 == true) {
    local_1b8 = false;
    if (local_1d8._M_value._M_dataplus._M_p != (_Alloc_hider)((long)&local_1d8._M_value + 0x10)) {
      operator_delete((void *)local_1d8._M_value._M_dataplus._M_p,local_1d8._16_8_ + 1);
    }
  }
  if (local_28[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_40);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_98,local_28,(AssertionResult *)"Lexer(\"infjunk\"sv).takeF32()",
               "true","false",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_30,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/wat-lexer.cpp"
               ,0x2b0,(char *)local_98._0_8_);
    testing::internal::AssertHelper::operator=(&local_30,(Message *)&local_40);
    testing::internal::AssertHelper::~AssertHelper(&local_30);
    if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_98._0_8_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)(local_98 + 0x10)
       ) {
      operator_delete((void *)local_98._0_8_,(ulong)(local_88._M_allocated_capacity + 1));
    }
    if (local_40 != (_Storage<double,_true>)0x0) {
      (**(code **)(*(long *)local_40 + 8))();
    }
  }
  if (local_20 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_20,local_20);
  }
  local_190 = false;
  buffer_06._M_str = "infjunk";
  buffer_06._M_len = 7;
  ::wasm::WATParser::Lexer::Lexer
            ((Lexer *)local_98,buffer_06,
             (optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)&local_1b0);
  bVar1 = ::wasm::WATParser::Lexer::takeF64();
  local_28[0] = (internal)(~bVar1 & 1);
  local_20 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (local_58 == true) {
    local_58 = false;
    if (local_78._M_value._M_dataplus._M_p != (_Alloc_hider)((long)&local_78._M_value + 0x10)) {
      operator_delete((void *)local_78._M_value._M_dataplus._M_p,local_78._16_8_ + 1);
    }
  }
  if ((pointer)local_98._8_8_ != (pointer)0x0) {
    operator_delete((void *)local_98._8_8_,local_88._8_8_ - local_98._8_8_);
  }
  if (local_190 == true) {
    local_190 = false;
    if (local_1b0._M_value._M_dataplus._M_p != (_Alloc_hider)((long)&local_1b0._M_value + 0x10)) {
      operator_delete((void *)local_1b0._M_value._M_dataplus._M_p,local_1b0._16_8_ + 1);
    }
  }
  if (local_28[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_40);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_98,local_28,(AssertionResult *)"Lexer(\"infjunk\"sv).takeF64()",
               "true","false",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_30,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/wat-lexer.cpp"
               ,0x2b1,(char *)local_98._0_8_);
    testing::internal::AssertHelper::operator=(&local_30,(Message *)&local_40);
    testing::internal::AssertHelper::~AssertHelper(&local_30);
    if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_98._0_8_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)(local_98 + 0x10)
       ) {
      operator_delete((void *)local_98._0_8_,(ulong)(local_88._M_allocated_capacity + 1));
    }
    if (local_40 != (_Storage<double,_true>)0x0) {
      (**(code **)(*(long *)local_40 + 8))();
    }
  }
  if (local_20 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_20,local_20);
  }
  local_168 = false;
  buffer_07._M_str = "Inf";
  buffer_07._M_len = 3;
  ::wasm::WATParser::Lexer::Lexer
            ((Lexer *)local_98,buffer_07,
             (optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)&local_188);
  uVar2 = ::wasm::WATParser::Lexer::takeF32();
  local_28[0] = (internal)((uVar2 & 0x100000000) == 0);
  local_20 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (local_58 == true) {
    local_58 = false;
    if (local_78._M_value._M_dataplus._M_p != (_Alloc_hider)((long)&local_78._M_value + 0x10)) {
      operator_delete((void *)local_78._M_value._M_dataplus._M_p,local_78._16_8_ + 1);
    }
  }
  if ((pointer)local_98._8_8_ != (pointer)0x0) {
    operator_delete((void *)local_98._8_8_,local_88._8_8_ - local_98._8_8_);
  }
  if (local_168 == true) {
    local_168 = false;
    if (local_188._M_value._M_dataplus._M_p != (_Alloc_hider)((long)&local_188._M_value + 0x10)) {
      operator_delete((void *)local_188._M_value._M_dataplus._M_p,local_188._16_8_ + 1);
    }
  }
  if (local_28[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_40);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_98,local_28,(AssertionResult *)"Lexer(\"Inf\"sv).takeF32()","true",
               "false",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_30,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/wat-lexer.cpp"
               ,0x2b3,(char *)local_98._0_8_);
    testing::internal::AssertHelper::operator=(&local_30,(Message *)&local_40);
    testing::internal::AssertHelper::~AssertHelper(&local_30);
    if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_98._0_8_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)(local_98 + 0x10)
       ) {
      operator_delete((void *)local_98._0_8_,(ulong)(local_88._M_allocated_capacity + 1));
    }
    if (local_40 != (_Storage<double,_true>)0x0) {
      (**(code **)(*(long *)local_40 + 8))();
    }
  }
  if (local_20 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_20,local_20);
  }
  local_140 = false;
  buffer_08._M_str = "Inf";
  buffer_08._M_len = 3;
  ::wasm::WATParser::Lexer::Lexer
            ((Lexer *)local_98,buffer_08,
             (optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)&local_160);
  bVar1 = ::wasm::WATParser::Lexer::takeF64();
  local_28[0] = (internal)(~bVar1 & 1);
  local_20 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (local_58 == true) {
    local_58 = false;
    if (local_78._M_value._M_dataplus._M_p != (_Alloc_hider)((long)&local_78._M_value + 0x10)) {
      operator_delete((void *)local_78._M_value._M_dataplus._M_p,local_78._16_8_ + 1);
    }
  }
  if ((pointer)local_98._8_8_ != (pointer)0x0) {
    operator_delete((void *)local_98._8_8_,local_88._8_8_ - local_98._8_8_);
  }
  if (local_140 == true) {
    local_140 = false;
    if (local_160._M_value._M_dataplus._M_p != (_Alloc_hider)((long)&local_160._M_value + 0x10)) {
      operator_delete((void *)local_160._M_value._M_dataplus._M_p,local_160._16_8_ + 1);
    }
  }
  if (local_28[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_40);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_98,local_28,(AssertionResult *)"Lexer(\"Inf\"sv).takeF64()","true",
               "false",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_30,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/wat-lexer.cpp"
               ,0x2b4,(char *)local_98._0_8_);
    testing::internal::AssertHelper::operator=(&local_30,(Message *)&local_40);
    testing::internal::AssertHelper::~AssertHelper(&local_30);
    if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_98._0_8_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)(local_98 + 0x10)
       ) {
      operator_delete((void *)local_98._0_8_,(ulong)(local_88._M_allocated_capacity + 1));
    }
    if (local_40 != (_Storage<double,_true>)0x0) {
      (**(code **)(*(long *)local_40 + 8))();
    }
  }
  if (local_20 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_20,local_20);
  }
  local_118 = false;
  buffer_09._M_str = "INF";
  buffer_09._M_len = 3;
  ::wasm::WATParser::Lexer::Lexer
            ((Lexer *)local_98,buffer_09,
             (optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)&local_138);
  uVar2 = ::wasm::WATParser::Lexer::takeF32();
  local_28[0] = (internal)((uVar2 & 0x100000000) == 0);
  local_20 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (local_58 == true) {
    local_58 = false;
    if (local_78._M_value._M_dataplus._M_p != (_Alloc_hider)((long)&local_78._M_value + 0x10)) {
      operator_delete((void *)local_78._M_value._M_dataplus._M_p,local_78._16_8_ + 1);
    }
  }
  if ((pointer)local_98._8_8_ != (pointer)0x0) {
    operator_delete((void *)local_98._8_8_,local_88._8_8_ - local_98._8_8_);
  }
  if (local_118 == true) {
    local_118 = false;
    if (local_138._M_value._M_dataplus._M_p != (_Alloc_hider)((long)&local_138._M_value + 0x10)) {
      operator_delete((void *)local_138._M_value._M_dataplus._M_p,local_138._16_8_ + 1);
    }
  }
  if (local_28[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_40);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_98,local_28,(AssertionResult *)"Lexer(\"INF\"sv).takeF32()","true",
               "false",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_30,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/wat-lexer.cpp"
               ,0x2b6,(char *)local_98._0_8_);
    testing::internal::AssertHelper::operator=(&local_30,(Message *)&local_40);
    testing::internal::AssertHelper::~AssertHelper(&local_30);
    if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_98._0_8_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)(local_98 + 0x10)
       ) {
      operator_delete((void *)local_98._0_8_,(ulong)(local_88._M_allocated_capacity + 1));
    }
    if (local_40 != (_Storage<double,_true>)0x0) {
      (**(code **)(*(long *)local_40 + 8))();
    }
  }
  if (local_20 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_20,local_20);
  }
  local_f0 = false;
  buffer_10._M_str = "INF";
  buffer_10._M_len = 3;
  ::wasm::WATParser::Lexer::Lexer
            ((Lexer *)local_98,buffer_10,
             (optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)&local_110);
  bVar1 = ::wasm::WATParser::Lexer::takeF64();
  local_28[0] = (internal)(~bVar1 & 1);
  local_20 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (local_58 == true) {
    local_58 = false;
    if (local_78._M_value._M_dataplus._M_p != (_Alloc_hider)((long)&local_78._M_value + 0x10)) {
      operator_delete((void *)local_78._M_value._M_dataplus._M_p,local_78._16_8_ + 1);
    }
  }
  if ((pointer)local_98._8_8_ != (pointer)0x0) {
    operator_delete((void *)local_98._8_8_,local_88._8_8_ - local_98._8_8_);
  }
  if (local_f0 == true) {
    local_f0 = false;
    if (local_110._M_value._M_dataplus._M_p != (_Alloc_hider)((long)&local_110._M_value + 0x10)) {
      operator_delete((void *)local_110._M_value._M_dataplus._M_p,local_110._16_8_ + 1);
    }
  }
  if (local_28[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_40);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_98,local_28,(AssertionResult *)"Lexer(\"INF\"sv).takeF64()","true",
               "false",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_30,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/wat-lexer.cpp"
               ,0x2b7,(char *)local_98._0_8_);
    testing::internal::AssertHelper::operator=(&local_30,(Message *)&local_40);
    testing::internal::AssertHelper::~AssertHelper(&local_30);
    if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_98._0_8_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)(local_98 + 0x10)
       ) {
      operator_delete((void *)local_98._0_8_,(ulong)(local_88._M_allocated_capacity + 1));
    }
    if (local_40 != (_Storage<double,_true>)0x0) {
      (**(code **)(*(long *)local_40 + 8))();
    }
  }
  if (local_20 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_20,local_20);
  }
  local_c8 = false;
  buffer_11._M_str = "infinity";
  buffer_11._M_len = 8;
  ::wasm::WATParser::Lexer::Lexer
            ((Lexer *)local_98,buffer_11,
             (optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)&local_e8);
  uVar2 = ::wasm::WATParser::Lexer::takeF32();
  local_28[0] = (internal)((uVar2 & 0x100000000) == 0);
  local_20 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (local_58 == true) {
    local_58 = false;
    if (local_78._M_value._M_dataplus._M_p != (_Alloc_hider)((long)&local_78._M_value + 0x10)) {
      operator_delete((void *)local_78._M_value._M_dataplus._M_p,local_78._16_8_ + 1);
    }
  }
  if ((pointer)local_98._8_8_ != (pointer)0x0) {
    operator_delete((void *)local_98._8_8_,local_88._8_8_ - local_98._8_8_);
  }
  if (local_c8 == true) {
    local_c8 = false;
    if (local_e8._M_value._M_dataplus._M_p != (_Alloc_hider)((long)&local_e8._M_value + 0x10)) {
      operator_delete((void *)local_e8._M_value._M_dataplus._M_p,local_e8._16_8_ + 1);
    }
  }
  if (local_28[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_40);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_98,local_28,(AssertionResult *)"Lexer(\"infinity\"sv).takeF32()",
               "true","false",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_30,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/wat-lexer.cpp"
               ,0x2b9,(char *)local_98._0_8_);
    testing::internal::AssertHelper::operator=(&local_30,(Message *)&local_40);
    testing::internal::AssertHelper::~AssertHelper(&local_30);
    if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_98._0_8_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)(local_98 + 0x10)
       ) {
      operator_delete((void *)local_98._0_8_,(ulong)(local_88._M_allocated_capacity + 1));
    }
    if (local_40 != (_Storage<double,_true>)0x0) {
      (**(code **)(*(long *)local_40 + 8))();
    }
  }
  if (local_20 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_20,local_20);
  }
  local_a0 = false;
  buffer_12._M_str = "infinity";
  buffer_12._M_len = 8;
  ::wasm::WATParser::Lexer::Lexer
            ((Lexer *)local_98,buffer_12,
             (optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)&local_c0);
  bVar1 = ::wasm::WATParser::Lexer::takeF64();
  local_28[0] = (internal)(bVar1 & 1 ^ 1);
  local_20 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (local_58 == true) {
    local_58 = false;
    if (local_78._M_value._M_dataplus._M_p != (_Alloc_hider)((long)&local_78._M_value + 0x10)) {
      operator_delete((void *)local_78._M_value._M_dataplus._M_p,local_78._16_8_ + 1);
    }
  }
  if ((pointer)local_98._8_8_ != (pointer)0x0) {
    operator_delete((void *)local_98._8_8_,local_88._8_8_ - local_98._8_8_);
  }
  if (local_a0 == true) {
    local_a0 = false;
    if (local_c0._M_value._M_dataplus._M_p != (_Alloc_hider)((long)&local_c0._M_value + 0x10)) {
      operator_delete((void *)local_c0._M_value._M_dataplus._M_p,local_c0._16_8_ + 1);
    }
  }
  if ((bVar1 & 1) != 0) {
    testing::Message::Message((Message *)&local_40);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_98,local_28,(AssertionResult *)"Lexer(\"infinity\"sv).takeF64()",
               "true","false",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_30,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/wat-lexer.cpp"
               ,0x2ba,(char *)local_98._0_8_);
    testing::internal::AssertHelper::operator=(&local_30,(Message *)&local_40);
    testing::internal::AssertHelper::~AssertHelper(&local_30);
    if (local_98._0_8_ != (long)local_98 + 0x10) {
      operator_delete((void *)local_98._0_8_,(ulong)(local_88._M_allocated_capacity + 1));
    }
    if (local_40 != (_Storage<double,_true>)0x0) {
      (**(code **)(*(long *)local_40 + 8))();
    }
    if (local_20 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_20,local_20);
    }
  }
  return;
}

Assistant:

TEST(LexerTest, LexInfinity) {
  EXPECT_EQ(Lexer("inf"sv).takeF32(), INFINITY);
  EXPECT_EQ(Lexer("inf"sv).takeF64(), INFINITY);

  EXPECT_EQ(Lexer("+inf"sv).takeF32(), INFINITY);
  EXPECT_EQ(Lexer("+inf"sv).takeF64(), INFINITY);

  EXPECT_EQ(Lexer("-inf"sv).takeF32(), -INFINITY);
  EXPECT_EQ(Lexer("-inf"sv).takeF64(), -INFINITY);

  EXPECT_FALSE(Lexer("infjunk"sv).takeF32());
  EXPECT_FALSE(Lexer("infjunk"sv).takeF64());

  EXPECT_FALSE(Lexer("Inf"sv).takeF32());
  EXPECT_FALSE(Lexer("Inf"sv).takeF64());

  EXPECT_FALSE(Lexer("INF"sv).takeF32());
  EXPECT_FALSE(Lexer("INF"sv).takeF64());

  EXPECT_FALSE(Lexer("infinity"sv).takeF32());
  EXPECT_FALSE(Lexer("infinity"sv).takeF64());
}